

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
ImageT<unsigned_char,_1U>::getUINT
          (ImageT<unsigned_char,_1U> *this,uint32_t numChannels,uint32_t targetBits)

{
  byte *pbVar1;
  uint in_ECX;
  uint in_EDX;
  long in_RSI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  byte bVar2;
  uint64_t outValue_3;
  uint32_t outValue_2;
  uint16_t outValue_1;
  uint8_t outValue;
  uchar *target;
  int value;
  uint32_t c;
  uint32_t x;
  uint32_t y;
  uint32_t targetBytes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *data;
  uint local_8c;
  allocator_type *__a;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 uVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  long local_58;
  uint local_50;
  undefined2 local_4c;
  undefined1 local_49;
  uchar *local_48;
  uint local_3c;
  uint local_38;
  uint local_34;
  uint local_30;
  allocator_type local_1e;
  undefined1 local_1d;
  uint local_1c;
  uint local_14;
  
  if (1 < in_EDX) {
    __assert_fail("numChannels <= componentCount",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                  ,0x3d7,
                  "virtual std::vector<uint8_t> ImageT<unsigned char, 1>::getUINT(uint32_t, uint32_t) const [componentType = unsigned char, componentCount = 1]"
                 );
  }
  uVar3 = true;
  if (((in_ECX != 8) && (uVar3 = true, in_ECX != 0x10)) && (uVar3 = true, in_ECX != 0x20)) {
    uVar3 = in_ECX == 0x40;
  }
  if ((bool)uVar3 == false) {
    __assert_fail("targetBits == 8 || targetBits == 16 || targetBits == 32 || targetBits == 64",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                  ,0x3d8,
                  "virtual std::vector<uint8_t> ImageT<unsigned char, 1>::getUINT(uint32_t, uint32_t) const [componentType = unsigned char, componentCount = 1]"
                 );
  }
  local_1c = in_ECX >> 3;
  local_1d = 0;
  __a = &local_1e;
  this_00 = in_RDI;
  local_14 = in_EDX;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x14a38a);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (this_00,CONCAT17(uVar3,in_stack_ffffffffffffff88),__a);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x14a3aa);
  for (local_30 = 0; local_30 < *(uint *)(in_RSI + 0xc); local_30 = local_30 + 1) {
    for (local_34 = 0; local_34 < *(uint *)(in_RSI + 8); local_34 = local_34 + 1) {
      for (local_38 = 0; local_38 < local_14; local_38 = local_38 + 1) {
        if (local_38 == 0) {
          pbVar1 = color<unsigned_char,_1U>::operator[]
                             ((color<unsigned_char,_1U> *)
                              (*(long *)(in_RSI + 0x18) +
                              (ulong)(local_30 * *(int *)(in_RSI + 8) + local_34)),0);
          bVar2 = *pbVar1;
        }
        else {
          bVar2 = local_38 == 3;
        }
        local_8c = (uint)bVar2;
        local_3c = local_8c;
        local_48 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x14a451);
        local_48 = local_48 +
                   (local_30 * *(int *)(in_RSI + 8) * local_14 + local_34 * local_14 + local_38) *
                   local_1c;
        if (local_1c == 1) {
          local_49 = (undefined1)local_3c;
          memcpy(local_48,&local_49,1);
        }
        else if (local_1c == 2) {
          local_4c = (undefined2)local_3c;
          memcpy(local_48,&local_4c,2);
        }
        else if (local_1c == 4) {
          local_50 = local_3c;
          memcpy(local_48,&local_50,4);
        }
        else if (local_1c == 8) {
          local_58 = (long)(int)local_3c;
          memcpy(local_48,&local_58,8);
        }
      }
    }
  }
  return in_RDI;
}

Assistant:

virtual std::vector<uint8_t> getUINT(uint32_t numChannels, uint32_t targetBits) const override {
        assert(numChannels <= componentCount);
        assert(targetBits == 8 || targetBits == 16 || targetBits == 32 || targetBits == 64);

        const uint32_t targetBytes = targetBits / 8;
        std::vector<uint8_t> data(height * width * numChannels * targetBytes);

        for (uint32_t y = 0; y < height; ++y) {
            for (uint32_t x = 0; x < width; ++x) {
                for (uint32_t c = 0; c < numChannels; ++c) {
                    const auto value = c < componentCount ? pixels[y * width + x][c] : c != 3 ? 0 : componentType{1};
                    auto* target = data.data() + (y * width * numChannels + x * numChannels + c) * targetBytes;

                    if (targetBytes == 1) {
                        const auto outValue = static_cast<uint8_t>(value);
                        std::memcpy(target, &outValue, targetBytes);
                    } else if (targetBytes == 2) {
                        const auto outValue = static_cast<uint16_t>(value);
                        std::memcpy(target, &outValue, targetBytes);
                    } else if (targetBytes == 4) {
                        const auto outValue = static_cast<uint32_t>(value);
                        std::memcpy(target, &outValue, targetBytes);
                    } else if (targetBytes == 8) {
                        const auto outValue = static_cast<uint64_t>(value);
                        std::memcpy(target, &outValue, targetBytes);
                    }
                }
            }
        }

        return data;
    }